

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_archive.hpp
# Opt level: O2

result_type __thiscall
pstore::serialize::archive::details::database_writer_policy::put<pstore::address>
          (database_writer_policy *this,address *value)

{
  typed_address<pstore::address> tVar1;
  shared_ptr<pstore::address> ptr;
  typed_address<pstore::address> addr;
  pair<std::shared_ptr<pstore::address>,_pstore::typed_address<pstore::address>_> local_40;
  typed_address<pstore::address> *local_28;
  undefined1 *local_20;
  
  ptr.super___shared_ptr<pstore::address,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ptr.super___shared_ptr<pstore::address,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addr.a_.a_ = (address)0;
  transaction_base::alloc_rw<pstore::address,void>(&local_40,this->transaction_,1);
  local_28 = &addr;
  local_20 = (undefined1 *)&ptr;
  std::tuple<std::shared_ptr<pstore::address>&,pstore::typed_address<pstore::address>&>::operator=
            ((tuple<std::shared_ptr<pstore::address>&,pstore::typed_address<pstore::address>&> *)
             &local_28,&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.first.super___shared_ptr<pstore::address,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  tVar1 = addr;
  (ptr.super___shared_ptr<pstore::address,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->a_ = value->a_;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ptr.super___shared_ptr<pstore::address,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return (result_type)(value_type)tVar1.a_.a_;
}

Assistant:

auto put (Ty const & value) -> result_type {
                        std::shared_ptr<Ty> ptr;
                        auto addr = typed_address<Ty>::null ();
                        std::tie (ptr, addr) = transaction_.template alloc_rw<Ty> ();
                        *ptr = value;
                        return addr.to_address ();
                    }